

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

bool lest::search(text *part,text *line)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  text *local_18;
  text *line_local;
  text *part_local;
  
  local_18 = line;
  line_local = part;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  local_30._M_current = (char *)std::__cxx11::string::end();
  local_38._M_current = (char *)std::__cxx11::string::begin();
  local_40 = (char *)std::__cxx11::string::end();
  local_20 = std::
             search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,bool(*)(char,char)>
                       (local_28,local_30,local_38,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_40,case_insensitive_equal);
  local_48._M_current = (char *)std::__cxx11::string::end();
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_48);
  return bVar1;
}

Assistant:

inline bool search( text part, text line )
    {
        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }